

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapshot.cpp
# Opt level: O3

void __thiscall TTD::SnapShot::Inflate(SnapShot *this,InflateMap *inflator,ThreadContextTTD *tCtx)

{
  PropertyId propertyId;
  fPtr_DoAddtlValueInstantiation p_Var1;
  SnapShot *pSVar2;
  bool bVar3;
  uint32 uVar4;
  Type *value;
  FrameDisplay *value_00;
  RecyclableObject *obj;
  DynamicObject *obj_00;
  ScriptContext *intoCtx;
  ThreadContext *pTVar5;
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_00;
  Recycler *alloc;
  HashedCharacterBuffer<char16_t> *this_01;
  FunctionBodyResolveInfo *fbInfo;
  UnorderedArrayListLink *pUVar6;
  UnorderedArrayListLink *pUVar7;
  FunctionBodyResolveInfo *pFVar8;
  SnapPrimitiveValue *snapValue;
  SlotArrayInfo *slotInfo;
  ScriptFunctionScopeInfo *funcScopeInfo;
  SnapObject *pSVar9;
  SnapContext *snpCtx;
  UnorderedArrayListLink *pUVar10;
  UnorderedArrayListLink *pUVar11;
  UnorderedArrayListLink *pUVar12;
  UnorderedArrayListLink *pUVar13;
  UnorderedArrayListLink *pUVar14;
  PropertyId *pPVar15;
  SnapObject *pSVar16;
  PropertyId *pPVar17;
  FunctionBodyResolveInfo *pFVar18;
  SnapPrimitiveValue *pSVar19;
  SlotArrayInfo *pSVar20;
  ScriptFunctionScopeInfo *pSVar21;
  SnapContext *pSVar22;
  HashedCharacterBuffer<char16_t> *local_b8;
  HashedCharacterBuffer<char16_t> *propertyName;
  TrackAllocData data;
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
  idToSnpBodyMap;
  PropertyRecord *pRecord;
  uint local_58;
  Entry *local_50;
  uint32 local_48;
  ThreadContextTTD *local_40;
  SnapShot *local_38;
  
  data.line = 0;
  data._36_4_ = 0;
  idToSnpBodyMap.m_h1Prime = 0;
  idToSnpBodyMap.m_capacity = 0;
  idToSnpBodyMap._12_4_ = 0;
  idToSnpBodyMap.m_hashArray._0_4_ = 0;
  local_40 = tCtx;
  uVar4 = UnorderedArrayList<TTD::NSSnapValues::FunctionBodyResolveInfo,_2048UL>::Count
                    (&this->m_functionBodyList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*> *
             )&data.line,uVar4);
  pFVar18 = (this->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar8 = (this->m_functionBodyList).m_inlineHeadBlock.BlockData;
  local_38 = this;
  if (pFVar8 != (FunctionBodyResolveInfo *)0x0 && pFVar8 != pFVar18) {
    pUVar6 = (this->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      propertyName = (HashedCharacterBuffer<char16_t> *)pFVar8;
      TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>::AddItem
                ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                  *)&data.line,pFVar8->FunctionBodyId,(FunctionBodyResolveInfo **)&propertyName);
      pFVar8 = pFVar8 + 1;
      if (pFVar8 == pFVar18) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) break;
        pFVar18 = pUVar6->CurrPos;
        pFVar8 = pUVar6->BlockData;
        pUVar6 = pUVar6->Next;
      }
    } while (pFVar8 != (FunctionBodyResolveInfo *)0x0);
  }
  pSVar2 = local_38;
  pRecord = (PropertyRecord *)0x0;
  local_58 = 0;
  local_50 = (Entry *)0x0;
  local_48 = 0;
  uVar4 = UnorderedArrayList<TTD::NSSnapObjects::SnapObject,_4096UL>::Count
                    (&local_38->m_compoundObjectList);
  TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::Initialize
            ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)&pRecord,
             uVar4);
  pSVar16 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar9 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar9 != (SnapObject *)0x0 && pSVar9 != pSVar16) {
    pUVar7 = (local_38->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      propertyName = (HashedCharacterBuffer<char16_t> *)pSVar9;
      TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>::AddItem
                ((TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*> *)
                 &pRecord,pSVar9->ObjectPtrId,(SnapObject **)&propertyName);
      pSVar9 = pSVar9 + 1;
      if (pSVar9 == pSVar16) {
        if (pUVar7 == (UnorderedArrayListLink *)0x0) break;
        pSVar16 = pUVar7->CurrPos;
        pSVar9 = pUVar7->BlockData;
        pUVar7 = pUVar7->Next;
      }
    } while (pSVar9 != (SnapObject *)0x0);
  }
  pFVar18 = (local_38->m_functionBodyList).m_inlineHeadBlock.CurrPos;
  pFVar8 = (local_38->m_functionBodyList).m_inlineHeadBlock.BlockData;
  if (pFVar8 != (FunctionBodyResolveInfo *)0x0 && pFVar8 != pFVar18) {
    pUVar6 = (local_38->m_functionBodyList).m_inlineHeadBlock.Next;
    do {
      NSSnapValues::InflateFunctionBody
                (pFVar8,inflator,
                 (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapValues::FunctionBodyResolveInfo_*>
                  *)&data.line);
      pFVar8 = pFVar8 + 1;
      if (pFVar8 == pFVar18) {
        if (pUVar6 == (UnorderedArrayListLink *)0x0) break;
        pFVar18 = pUVar6->CurrPos;
        pFVar8 = pUVar6->BlockData;
        pUVar6 = pUVar6->Next;
      }
    } while (pFVar8 != (FunctionBodyResolveInfo *)0x0);
  }
  pSVar2 = local_38;
  pSVar19 = (local_38->m_primitiveObjectList).m_inlineHeadBlock.CurrPos;
  snapValue = (local_38->m_primitiveObjectList).m_inlineHeadBlock.BlockData;
  if (snapValue != (SnapPrimitiveValue *)0x0 && snapValue != pSVar19) {
    pUVar11 = (local_38->m_primitiveObjectList).m_inlineHeadBlock.Next;
    do {
      NSSnapValues::InflateSnapPrimitiveValue(snapValue,inflator);
      snapValue = snapValue + 1;
      if (snapValue == pSVar19) {
        if (pUVar11 == (UnorderedArrayListLink *)0x0) break;
        pSVar19 = pUVar11->CurrPos;
        snapValue = pUVar11->BlockData;
        pUVar11 = pUVar11->Next;
      }
    } while (snapValue != (SnapPrimitiveValue *)0x0);
  }
  pSVar16 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar9 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar9 != (SnapObject *)0x0 && pSVar9 != pSVar16) {
    pUVar7 = (local_38->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      InflateSingleObject(local_38,pSVar9,inflator,
                          (TTDIdentifierDictionary<unsigned_long,_TTD::NSSnapObjects::SnapObject_*>
                           *)&pRecord);
      pSVar9 = pSVar9 + 1;
      if (pSVar9 == pSVar16) {
        if (pUVar7 == (UnorderedArrayListLink *)0x0) break;
        pSVar16 = pUVar7->CurrPos;
        pSVar9 = pUVar7->BlockData;
        pUVar7 = pUVar7->Next;
      }
    } while (pSVar9 != (SnapObject *)0x0);
  }
  pSVar2 = local_38;
  pSVar20 = (local_38->m_slotArrayEntries).m_inlineHeadBlock.CurrPos;
  slotInfo = (local_38->m_slotArrayEntries).m_inlineHeadBlock.BlockData;
  if (slotInfo != (SlotArrayInfo *)0x0 && slotInfo != pSVar20) {
    pUVar12 = (local_38->m_slotArrayEntries).m_inlineHeadBlock.Next;
    do {
      value = NSSnapValues::InflateSlotArrayInfo(slotInfo,inflator);
      InflateMap::AddSlotArray(inflator,slotInfo->SlotId,value);
      slotInfo = slotInfo + 1;
      if (slotInfo == pSVar20) {
        if (pUVar12 == (UnorderedArrayListLink *)0x0) break;
        pSVar20 = pUVar12->CurrPos;
        slotInfo = pUVar12->BlockData;
        pUVar12 = pUVar12->Next;
      }
    } while (slotInfo != (SlotArrayInfo *)0x0);
  }
  pSVar21 = (pSVar2->m_scopeEntries).m_inlineHeadBlock.CurrPos;
  funcScopeInfo = (pSVar2->m_scopeEntries).m_inlineHeadBlock.BlockData;
  if (funcScopeInfo != (ScriptFunctionScopeInfo *)0x0 && funcScopeInfo != pSVar21) {
    pUVar13 = (pSVar2->m_scopeEntries).m_inlineHeadBlock.Next;
    do {
      value_00 = NSSnapValues::InflateScriptFunctionScopeInfo(funcScopeInfo,inflator);
      InflateMap::AddEnvironment(inflator,funcScopeInfo->ScopeId,value_00);
      funcScopeInfo = funcScopeInfo + 1;
      if (funcScopeInfo == pSVar21) {
        if (pUVar13 == (UnorderedArrayListLink *)0x0) break;
        pSVar21 = pUVar13->CurrPos;
        funcScopeInfo = pUVar13->BlockData;
        pUVar13 = pUVar13->Next;
      }
    } while (funcScopeInfo != (ScriptFunctionScopeInfo *)0x0);
  }
  pSVar16 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.CurrPos;
  pSVar9 = (pSVar2->m_compoundObjectList).m_inlineHeadBlock.BlockData;
  if (pSVar9 != (SnapObject *)0x0 && pSVar9 != pSVar16) {
    pUVar7 = (local_38->m_compoundObjectList).m_inlineHeadBlock.Next;
    do {
      obj = InflateMap::LookupObject(inflator,pSVar9->ObjectPtrId);
      p_Var1 = local_38->m_snapObjectVTableArray[pSVar9->SnapObjectTag].AddtlInstationationFunc;
      if (p_Var1 != (fPtr_DoAddtlValueInstantiation)0x0) {
        (*p_Var1)(pSVar9,obj,inflator);
      }
      bVar3 = Js::DynamicType::Is(pSVar9->SnapType->JsTypeId);
      if (bVar3) {
        obj_00 = Js::VarTo<Js::DynamicObject,Js::RecyclableObject>(obj);
        NSSnapObjects::StdPropertyRestore(pSVar9,obj_00,inflator);
      }
      pSVar9 = pSVar9 + 1;
      if (pSVar9 == pSVar16) {
        if (pUVar7 == (UnorderedArrayListLink *)0x0) break;
        pSVar16 = pUVar7->CurrPos;
        pSVar9 = pUVar7->BlockData;
        pUVar7 = pUVar7->Next;
      }
    } while (pSVar9 != (SnapObject *)0x0);
  }
  pSVar2 = local_38;
  ReLinkThreadContextInfo(local_38,inflator,local_40);
  pSVar22 = (pSVar2->m_ctxList).m_inlineHeadBlock.CurrPos;
  snpCtx = (pSVar2->m_ctxList).m_inlineHeadBlock.BlockData;
  if (snpCtx != (SnapContext *)0x0 && snpCtx != pSVar22) {
    pUVar14 = (pSVar2->m_ctxList).m_inlineHeadBlock.Next;
    do {
      intoCtx = InflateMap::LookupScriptContext(inflator,snpCtx->ScriptContextLogId);
      NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx,intoCtx,inflator);
      snpCtx = snpCtx + 1;
      if (snpCtx == pSVar22) {
        if (pUVar14 == (UnorderedArrayListLink *)0x0) break;
        pSVar22 = pUVar14->CurrPos;
        snpCtx = pUVar14->BlockData;
        pUVar14 = pUVar14->Next;
      }
    } while (snpCtx != (SnapContext *)0x0);
  }
  pTVar5 = ThreadContextTTD::GetThreadContext(local_40);
  this_00 = ThreadContext::GetSymbolRegistrationMap_TTD(pTVar5);
  JsUtil::
  BaseDictionary<Js::HashedCharacterBuffer<char16_t>_*,_const_Js::PropertyRecord_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::Clear(this_00);
  pPVar15 = (pSVar2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.CurrPos;
  pPVar17 = (pSVar2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.BlockData;
  if (pPVar17 != (PropertyId *)0x0 && pPVar17 != pPVar15) {
    pUVar10 = (pSVar2->m_tcSymbolRegistrationMapContents).m_inlineHeadBlock.Next;
    do {
      propertyId = *pPVar17;
      pTVar5 = ThreadContextTTD::GetThreadContext(local_40);
      idToSnpBodyMap._24_8_ = ThreadContext::GetPropertyName(pTVar5,propertyId);
      pTVar5 = ThreadContextTTD::GetThreadContext(local_40);
      propertyName = (HashedCharacterBuffer<char16_t> *)
                     &Js::HashedCharacterBuffer<char16_t>::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_42fdd37;
      data.filename._0_4_ = 0x275;
      alloc = Memory::Recycler::TrackAllocInfo(pTVar5->recycler,(TrackAllocData *)&propertyName);
      this_01 = (HashedCharacterBuffer<char16_t> *)new<Memory::Recycler>(0x10,alloc,0x387914);
      Js::HashedCharacterBuffer<char16_t>::HashedCharacterBuffer
                (this_01,(char16_t *)(idToSnpBodyMap._24_8_ + 0x18),
                 *(uint *)(idToSnpBodyMap._24_8_ + 0x14) >> 1);
      local_b8 = this_01;
      JsUtil::
      BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)0>
                ((BaseDictionary<Js::HashedCharacterBuffer<char16_t>*,Js::PropertyRecord_const*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)this_00,&local_b8,(PropertyRecord **)&idToSnpBodyMap.m_count);
      pPVar17 = pPVar17 + 1;
      if (pPVar17 == pPVar15) {
        if (pUVar10 == (UnorderedArrayListLink *)0x0) break;
        pPVar15 = pUVar10->CurrPos;
        pPVar17 = pUVar10->BlockData;
        pUVar10 = pUVar10->Next;
      }
    } while (pPVar17 != (PropertyId *)0x0);
  }
  if (local_50 != (Entry *)0x0) {
    Memory::
    DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapObjects::SnapObject*>::Entry>
              (&Memory::HeapAllocator::Instance,(ulong)local_58,local_50);
  }
  if (idToSnpBodyMap._8_8_ != 0) {
    Memory::
    DeleteArray<Memory::HeapAllocator,TTD::TTDIdentifierDictionary<unsigned_long,TTD::NSSnapValues::FunctionBodyResolveInfo*>::Entry>
              (&Memory::HeapAllocator::Instance,(ulong)idToSnpBodyMap.m_h1Prime,
               (Entry *)idToSnpBodyMap._8_8_);
  }
  return;
}

Assistant:

void SnapShot::Inflate(InflateMap* inflator, ThreadContextTTD* tCtx) const
    {
        //We assume the caller has inflated all of the ScriptContexts for us and we are just filling in the objects

        ////

        //set the map from all function body ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapValues::FunctionBodyResolveInfo*> idToSnpBodyMap;
        idToSnpBodyMap.Initialize(this->m_functionBodyList.Count());

        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpBodyMap.AddItem(iter.Current()->FunctionBodyId, iter.Current());
        }

        //set the map from all compound object ids to their snap representations
        TTDIdentifierDictionary<TTD_PTR_ID, NSSnapObjects::SnapObject*> idToSnpObjectMap;
        idToSnpObjectMap.Initialize(this->m_compoundObjectList.Count());

        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            idToSnpObjectMap.AddItem(iter.Current()->ObjectPtrId, iter.Current());
        }

        ////

        //inflate all the function bodies
        for(auto iter = this->m_functionBodyList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::FunctionBodyResolveInfo* fbInfo = iter.Current();
            NSSnapValues::InflateFunctionBody(fbInfo, inflator, idToSnpBodyMap);
        }

        //inflate all the primitive objects
        for(auto iter = this->m_primitiveObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapPrimitiveValue* pSnap = iter.Current();
            NSSnapValues::InflateSnapPrimitiveValue(pSnap, inflator);
        }

        //inflate all the regular objects
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sObj = iter.Current();
            this->InflateSingleObject(sObj, inflator, idToSnpObjectMap);
        }

        //take care of all the slot arrays
        for(auto iter = this->m_slotArrayEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SlotArrayInfo* sai = iter.Current();
            Field(Js::Var)* slots = NSSnapValues::InflateSlotArrayInfo(sai, inflator);

            inflator->AddSlotArray(sai->SlotId, slots);
        }

        //and the scope entries
        for(auto iter = this->m_scopeEntries.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::ScriptFunctionScopeInfo* sfsi = iter.Current();
            Js::FrameDisplay* frame = NSSnapValues::InflateScriptFunctionScopeInfo(sfsi, inflator);

            inflator->AddEnvironment(sfsi->ScopeId, frame);
        }

        //Link up the object pointers
        for(auto iter = this->m_compoundObjectList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapObjects::SnapObject* sobj = iter.Current();
            Js::RecyclableObject* iobj = inflator->LookupObject(sobj->ObjectPtrId);

            NSSnapObjects::fPtr_DoAddtlValueInstantiation addtlInstFPtr = this->m_snapObjectVTableArray[(uint32)sobj->SnapObjectTag].AddtlInstationationFunc;
            if(addtlInstFPtr != nullptr)
            {
                addtlInstFPtr(sobj, iobj, inflator);
            }

            if(Js::DynamicType::Is(sobj->SnapType->JsTypeId))
            {
                NSSnapObjects::StdPropertyRestore(sobj, Js::VarTo<Js::DynamicObject>(iobj), inflator);
            }
        }

        this->ReLinkThreadContextInfo(inflator, tCtx);

        for(auto iter = this->m_ctxList.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            const NSSnapValues::SnapContext* snpCtx = iter.Current();
            Js::ScriptContext* sctx = inflator->LookupScriptContext(snpCtx->ScriptContextLogId);

            NSSnapValues::ResetPendingAsyncBufferModInfo(snpCtx, sctx, inflator);
        }

        //reset the threadContext symbol map
        JsUtil::BaseDictionary<Js::HashedCharacterBuffer<char16>*, const Js::PropertyRecord*, Recycler, PowerOf2SizePolicy, Js::PropertyRecordStringHashComparer>* tcSymbolRegistrationMap = tCtx->GetThreadContext()->GetSymbolRegistrationMap_TTD();
        tcSymbolRegistrationMap->Clear();

        for(auto iter = this->m_tcSymbolRegistrationMapContents.GetIterator(); iter.IsValid(); iter.MoveNext())
        {
            Js::PropertyId pid = *iter.Current();
            const Js::PropertyRecord* pRecord = tCtx->GetThreadContext()->GetPropertyName(pid);
            Js::HashedCharacterBuffer<char16> * propertyName = RecyclerNew(tCtx->GetThreadContext()->GetRecycler(), Js::HashedCharacterBuffer<char16>, pRecord->GetBuffer(), pRecord->GetLength());

            tcSymbolRegistrationMap->Add(propertyName, pRecord);
        }
    }